

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O1

void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph *self,ImFontGlyph v)

{
  int iVar1;
  ImFontGlyph *pIVar2;
  ImFontGlyph *pIVar3;
  int iVar4;
  int iVar5;
  
  iVar1 = self->Capacity;
  if (self->Size == iVar1) {
    iVar5 = self->Size + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      pIVar3 = (ImFontGlyph *)ImGui::MemAlloc((long)iVar5 * 0x28);
      if (self->Data != (ImFontGlyph *)0x0) {
        memcpy(pIVar3,self->Data,(long)self->Size * 0x28);
        ImGui::MemFree(self->Data);
      }
      self->Data = pIVar3;
      self->Capacity = iVar5;
    }
  }
  pIVar3 = self->Data;
  iVar1 = self->Size;
  pIVar3[iVar1].U1 = v.U1;
  pIVar3[iVar1].V1 = v.V1;
  pIVar2 = pIVar3 + iVar1;
  pIVar2->X1 = v.X1;
  pIVar2->Y1 = v.Y1;
  *(undefined8 *)(&pIVar2->X1 + 2) = v._24_8_;
  pIVar3 = pIVar3 + iVar1;
  pIVar3->Codepoint = v.Codepoint;
  *(undefined2 *)&pIVar3->field_0x2 = v._2_2_;
  pIVar3->AdvanceX = v.AdvanceX;
  pIVar3->X0 = v.X0;
  pIVar3->Y0 = v.Y0;
  self->Size = self->Size + 1;
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontGlyph_push_back(ImVector_ImFontGlyph* self,const ImFontGlyph v)
{
    return self->push_back(v);
}